

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# psocketaddress.c
# Opt level: O2

psize p_socket_address_get_native_size(PSocketAddress *addr)

{
  psize pStack_10;
  
  if (addr == (PSocketAddress *)0x0) {
    pStack_10 = 0;
  }
  else if (addr->family == P_SOCKET_FAMILY_INET) {
    pStack_10 = 0x10;
  }
  else if (addr->family == P_SOCKET_FAMILY_INET6) {
    pStack_10 = 0x1c;
  }
  else {
    pStack_10 = 0;
    printf("** Warning: %s **\n",
           "PSocketAddress::p_socket_address_get_native_size: unsupported socket family");
  }
  return pStack_10;
}

Assistant:

P_LIB_API psize
p_socket_address_get_native_size (const PSocketAddress *addr)
{
	if (P_UNLIKELY (addr == NULL))
		return 0;

	if (addr->family == P_SOCKET_FAMILY_INET)
		return sizeof (struct sockaddr_in);
#ifdef AF_INET6
	else if (addr->family == P_SOCKET_FAMILY_INET6)
		return sizeof (struct sockaddr_in6);
#endif
	else {
		P_WARNING ("PSocketAddress::p_socket_address_get_native_size: unsupported socket family");
		return 0;
	}
}